

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitmap.cpp
# Opt level: O0

QBitmap * QBitmap::fromData(QSize *size,uchar *bits,Format monoFormat)

{
  int iVar1;
  int iVar2;
  uchar *__dest;
  long in_RDX;
  undefined8 in_RSI;
  QImage *in_RDI;
  long in_FS_OFFSET;
  int y;
  int bytesPerLine;
  QImage image;
  ImageConversionFlag in_stack_ffffffffffffff6c;
  QFlags<Qt::ImageConversionFlag> *in_stack_ffffffffffffff70;
  QImage *this;
  undefined4 in_stack_ffffffffffffff78;
  GlobalColor in_stack_ffffffffffffff7c;
  int iVar3;
  QImage *this_00;
  int local_6c;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  undefined1 local_40 [16];
  QImageData *local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QImage::QImage(in_RDI,(QSize *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (Format)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  QColor::QColor((QColor *)in_RDI,in_stack_ffffffffffffff7c);
  QColor::rgb((QColor *)in_RDI);
  QImage::setColor(this_00,(int)((ulong)in_RDI >> 0x20),(QRgb)in_RDI);
  QColor::QColor((QColor *)in_RDI,in_stack_ffffffffffffff7c);
  QColor::rgb((QColor *)in_RDI);
  QImage::setColor(this_00,(int)((ulong)in_RDI >> 0x20),(QRgb)in_RDI);
  iVar1 = QSize::width((QSize *)0x281431);
  iVar1 = (iVar1 + 7) / 8;
  local_6c = 0;
  while( true ) {
    iVar3 = local_6c;
    iVar2 = QSize::height((QSize *)0x28145a);
    flags.i = (Int)((ulong)in_RSI >> 0x20);
    if (iVar2 <= iVar3) break;
    __dest = QImage::scanLine((QImage *)CONCAT44(iVar3,in_stack_ffffffffffffff78),
                              (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
    memcpy(__dest,(void *)(in_RDX + iVar1 * local_6c),(long)iVar1);
    local_6c = local_6c + 1;
  }
  QFlags<Qt::ImageConversionFlag>::QFlags(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  this = (QImage *)local_40;
  fromImage((QImage *)CONCAT44(iVar3,in_stack_ffffffffffffff78),(ImageConversionFlags)flags.i);
  QImage::~QImage(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QBitmap *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QBitmap QBitmap::fromData(const QSize &size, const uchar *bits, QImage::Format monoFormat)
{
    Q_ASSERT(monoFormat == QImage::Format_Mono || monoFormat == QImage::Format_MonoLSB);

    QImage image(size, monoFormat);
    image.setColor(0, QColor(Qt::color0).rgb());
    image.setColor(1, QColor(Qt::color1).rgb());

    // Need to memcpy each line separately since QImage is 32bit aligned and
    // this data is only byte aligned...
    int bytesPerLine = (size.width() + 7) / 8;
    for (int y = 0; y < size.height(); ++y)
        memcpy(image.scanLine(y), bits + bytesPerLine * y, bytesPerLine);
    return QBitmap::fromImage(std::move(image));
}